

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O3

bool httplib::detail::is_valid_path(string *path)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  
  uVar2 = path->_M_string_length;
  if (uVar2 == 0) {
    uVar7 = 0;
LAB_0012362b:
    if (uVar7 < uVar2) {
      lVar8 = 0;
      do {
        uVar3 = uVar7 + 1;
        uVar4 = uVar7;
        if (uVar7 + 1 < uVar2) {
          uVar3 = uVar2;
        }
        do {
          uVar5 = uVar4;
          if ((path->_M_dataplus)._M_p[uVar4] == '/') break;
          uVar4 = uVar4 + 1;
          uVar5 = uVar3;
        } while (uVar3 != uVar4);
        pcVar6 = (char *)(uVar5 - uVar7);
        if (pcVar6 == (char *)0x0) {
          __assert_fail("len > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/httplib/httplib.hpp"
                        ,0x5d0,"bool httplib::detail::is_valid_path(const std::string &)");
        }
        iVar1 = std::__cxx11::string::compare((ulong)path,uVar7,pcVar6);
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare((ulong)path,uVar7,pcVar6);
          if (iVar1 == 0) {
            if (lVar8 == 0) {
              return false;
            }
            lVar8 = lVar8 + -1;
          }
          else {
            lVar8 = lVar8 + 1;
          }
        }
        uVar2 = path->_M_string_length;
        if (uVar5 < uVar2) {
          while ((path->_M_dataplus)._M_p[uVar5] == '/') {
            uVar5 = uVar5 + 1;
            if (uVar2 == uVar5) {
              return true;
            }
          }
        }
        uVar7 = uVar5;
        if (uVar2 <= uVar5) {
          return true;
        }
      } while( true );
    }
  }
  else {
    uVar7 = 0;
    do {
      if ((path->_M_dataplus)._M_p[uVar7] != '/') goto LAB_0012362b;
      uVar7 = uVar7 + 1;
    } while (uVar2 != uVar7);
  }
  return true;
}

Assistant:

inline bool is_valid_path(const std::string& path) {
            size_t level = 0;
            size_t i = 0;

            // Skip slash
            while (i < path.size() && path[i] == '/') {
                i++;
            }

            while (i < path.size()) {
                // Read component
                auto beg = i;
                while (i < path.size() && path[i] != '/') {
                    i++;
                }

                auto len = i - beg;
                assert(len > 0);

                if (!path.compare(beg, len, ".")) {
                    ;
                }
                else if (!path.compare(beg, len, "..")) {
                    if (level == 0) { return false; }
                    level--;
                }
                else {
                    level++;
                }

                // Skip slash
                while (i < path.size() && path[i] == '/') {
                    i++;
                }
            }

            return true;
        }